

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<TTD::NSLogEvents::EventLogEntry_const*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<TTD::NSLogEvents::EventLogEntry_const*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<TTD::NSLogEvents::EventLogEntry_const*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EventLogEntry **key,unsigned_long *value)

{
  BaseDictionary<TTD::NSLogEvents::EventLogEntry_const*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  long lVar2;
  code *pcVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  long lVar9;
  uint depth;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint hashCode;
  
  lVar11 = *(long *)this;
  if (lVar11 == 0) {
    BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar11 = *(long *)this;
  }
  hashCode = (uint)((ulong)*key >> 3) | 1;
  uVar6 = BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar10 = *(uint *)(lVar11 + (ulong)uVar6 * 4);
  if ((int)uVar10 < 0) {
    cVar4 = (char)(uVar10 >> 0x18);
    depth = 0;
  }
  else {
    depth = 0;
    do {
      if (*(EventLogEntry **)(*(long *)(this + 8) + 0x10 + (ulong)uVar10 * 0x18) == *key) {
        if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
          return -1;
        }
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        return -1;
      }
      depth = depth + 1;
      uVar10 = *(uint *)(*(long *)(this + 8) + (ulong)uVar10 * 0x18 + 8);
    } while (-1 < (int)uVar10);
    cVar4 = (char)(uVar10 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  iVar12 = -1;
  if (cVar4 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      iVar12 = *(int *)(this + 0x20);
      if (iVar12 == *(int *)(this + 0x18)) {
        BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        uVar6 = BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        iVar12 = *(int *)(this + 0x20);
      }
      *(int *)(this + 0x20) = iVar12 + 1;
      if (*(int *)(this + 0x18) < iVar12 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar5) goto LAB_008ed2c8;
        *puVar8 = 0;
      }
      if (*(int *)(this + 0x18) <= iVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar5) goto LAB_008ed2c8;
        *puVar8 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar5) goto LAB_008ed2c8;
        *puVar8 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar5) goto LAB_008ed2c8;
        *puVar8 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar5) {
LAB_008ed2c8:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      iVar12 = *(int *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar7 = BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex((EntryType *)((long)iVar12 * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar7;
      }
    }
    lVar11 = *(long *)(this + 8);
    lVar9 = (long)iVar12;
    *(unsigned_long *)(lVar11 + lVar9 * 0x18) = *value;
    *(EventLogEntry **)(lVar11 + 0x10 + lVar9 * 0x18) = *key;
    lVar2 = *(long *)this;
    *(undefined4 *)(lVar11 + 8 + lVar9 * 0x18) = *(undefined4 *)(lVar2 + (ulong)uVar6 * 4);
    *(int *)(lVar2 + (ulong)uVar6 * 4) = iVar12;
    uVar6 = 0;
    iVar7 = iVar12;
    do {
      iVar7 = *(int *)(lVar11 + 8 + (long)iVar7 * 0x18);
      uVar6 = uVar6 + 1;
    } while (iVar7 != -1);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar6);
    }
  }
  return iVar12;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }